

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# statement.cpp
# Opt level: O3

ExecuteResult __thiscall Statement::executeSelect(Statement *this,Table *t)

{
  Cursor *this_00;
  char *src;
  uint uVar1;
  Row r;
  Row local_84;
  
  this_00 = Table::tableStart(t);
  if (t->numRows != 0) {
    uVar1 = 0;
    do {
      src = Cursor::value(this_00);
      Row::deserialize(&local_84,src);
      Row::print(&local_84);
      Cursor::advance(this_00);
      uVar1 = uVar1 + 1;
    } while (uVar1 < t->numRows);
  }
  operator_delete(this_00,0x18);
  return ExecuteSucess;
}

Assistant:

ExecuteResult Statement::executeSelect(Table *t) {
		Row r;
		Cursor *c = t->tableStart();
		for (int i = 0; i < t->rows(); ++i) {
			r.deserialize(c->value());
			r.print();
			c->advance();
		}
		delete c;
		return ExecuteSucess;
	}